

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O0

void __thiscall cmCTestLaunchReporter::cmCTestLaunchReporter(cmCTestLaunchReporter *this)

{
  string local_30 [32];
  cmCTestLaunchReporter *local_10;
  cmCTestLaunchReporter *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->OptionSource);
  std::__cxx11::string::string((string *)&this->OptionLanguage);
  std::__cxx11::string::string((string *)&this->OptionTargetName);
  std::__cxx11::string::string((string *)&this->OptionTargetType);
  std::__cxx11::string::string((string *)&this->OptionBuildDir);
  std::__cxx11::string::string((string *)&this->OptionFilterPrefix);
  std::__cxx11::string::string((string *)&this->CWD);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RealArgs);
  std::__cxx11::string::string((string *)&this->LogHash);
  std::__cxx11::string::string((string *)&this->LogDir);
  std::__cxx11::string::string((string *)&this->LogOut);
  std::__cxx11::string::string((string *)&this->LogErr);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Labels);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->RegexWarning);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->RegexWarningSuppress);
  std::__cxx11::string::string((string *)&this->SourceDir);
  this->Passthru = true;
  this->ExitCode = 1;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->CWD,local_30);
  std::__cxx11::string::~string(local_30);
  ComputeFileNames(this);
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[37]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
             &this->RegexWarning,(char (*) [37])"(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[33]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
             &this->RegexWarning,(char (*) [33])"(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<char_const(&)[25]>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
             &this->RegexWarning,(char (*) [25])"(^|[ :])[Nn][Oo][Tt][Ee]");
  return;
}

Assistant:

cmCTestLaunchReporter::cmCTestLaunchReporter()
{
  this->Passthru = true;
  this->ExitCode = 1;
  this->CWD = cmSystemTools::GetCurrentWorkingDirectory();

  this->ComputeFileNames();

  // Common compiler warning formats.  These are much simpler than the
  // full log-scraping expressions because we do not need to extract
  // file and line information.
  this->RegexWarning.emplace_back("(^|[ :])[Ww][Aa][Rr][Nn][Ii][Nn][Gg]");
  this->RegexWarning.emplace_back("(^|[ :])[Rr][Ee][Mm][Aa][Rr][Kk]");
  this->RegexWarning.emplace_back("(^|[ :])[Nn][Oo][Tt][Ee]");
}